

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O0

Dec_Graph_t * Dec_GraphCreate(int nLeaves)

{
  Dec_Graph_t *__s;
  Dec_Node_t *pDVar1;
  Dec_Graph_t *pGraph;
  int nLeaves_local;
  
  __s = (Dec_Graph_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->nLeaves = nLeaves;
  __s->nSize = nLeaves;
  __s->nCap = nLeaves * 2 + 0x32;
  pDVar1 = (Dec_Node_t *)malloc((long)__s->nCap * 0x18);
  __s->pNodes = pDVar1;
  memset(__s->pNodes,0,(long)__s->nSize * 0x18);
  return __s;
}

Assistant:

static inline Dec_Graph_t * Dec_GraphCreate( int nLeaves )   
{
    Dec_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Dec_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Dec_Graph_t) );
    pGraph->nLeaves = nLeaves;
    pGraph->nSize = nLeaves;
    pGraph->nCap = 2 * nLeaves + 50;
    pGraph->pNodes = ABC_ALLOC( Dec_Node_t, pGraph->nCap );
    memset( pGraph->pNodes, 0, sizeof(Dec_Node_t) * pGraph->nSize );
    return pGraph;
}